

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_string.h
# Opt level: O1

int JetHead::stl_vsprintf<std::__cxx11::string>
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str,char *format,
              __va_list_tag *params)

{
  int iVar1;
  va_list p2;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  local_28 = params->reg_save_area;
  local_38._0_4_ = params->gp_offset;
  local_38._4_4_ = params->fp_offset;
  pvStack_30 = params->overflow_arg_area;
  iVar1 = vsnprintf((char *)0x0,0,format,params);
  std::__cxx11::string::resize((ulong)str,(char)iVar1);
  iVar1 = vsprintf((str->_M_dataplus)._M_p,format,&local_38);
  return iVar1;
}

Assistant:

int		stl_vsprintf( _string &str, const char *format, va_list params )
	{
		va_list p2;
		va_copy( p2, params );
		int size = ::vsnprintf( NULL, 0, format, params );
		str.resize( size );
		return ::vsprintf( (char*)str.c_str(), format, p2 );
		va_end( p2 );
	}